

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

char16_t * __thiscall QtPrivate::qustrcasechr(QtPrivate *this,QStringView str,char16_t c)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  storage_type_conflict *psVar4;
  long lVar5;
  storage_type_conflict *psVar6;
  QtPrivate *pQVar7;
  QtPrivate *pQVar8;
  
  psVar6 = str.m_data;
  uVar3 = (uint)str.m_size;
  uVar2 = (uint)(int)(short)*(ushort *)
                             (QUnicodeTables::uc_properties +
                             (ulong)*(ushort *)
                                     (QUnicodeTables::uc_property_trie +
                                     (ulong)((uVar3 & 0x1f) +
                                            (uint)*(ushort *)
                                                   (QUnicodeTables::uc_property_trie +
                                                   (ulong)(uVar3 >> 5) * 2)) * 2) * 0x14 + 0xe) >> 1
  ;
  if ((*(ushort *)
        (QUnicodeTables::uc_properties +
        (ulong)*(ushort *)
                (QUnicodeTables::uc_property_trie +
                (ulong)((uVar3 & 0x1f) +
                       (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)(uVar3 >> 5) * 2)
                       ) * 2) * 0x14 + 0xe) & 1) == 0) {
    uVar3 = uVar2 + uVar3;
  }
  else {
    lVar5 = (long)(short)uVar2;
    if (*(short *)(QUnicodeTables::specialCaseMap + lVar5 * 2) == 1) {
      uVar3 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar5 * 2 + 2);
    }
  }
  psVar4 = psVar6;
  pQVar8 = this;
  if (0 < (long)psVar6 >> 2) {
    pQVar8 = this + ((long)psVar6 * 2 & 0xfffffffffffffff8);
    lVar5 = ((long)psVar6 >> 2) + 1;
    pQVar7 = this + 4;
    do {
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)
                         (ulong)uVar3,(QChar *)(ulong)(ushort)*(char16_t *)(pQVar7 + -4));
      if (bVar1) {
        return (char16_t *)(pQVar7 + -4);
      }
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)
                         (ulong)uVar3,(QChar *)(ulong)(ushort)*(char16_t *)(pQVar7 + -2));
      if (bVar1) {
        return (char16_t *)(pQVar7 + -2);
      }
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)
                         (ulong)uVar3,(QChar *)(ulong)(ushort)*(char16_t *)pQVar7);
      if (bVar1) {
        return (char16_t *)pQVar7;
      }
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)
                         (ulong)uVar3,(QChar *)(ulong)(ushort)*(char16_t *)(pQVar7 + 2));
      if (bVar1) {
        return (char16_t *)(pQVar7 + 2);
      }
      lVar5 = lVar5 + -1;
      pQVar7 = pQVar7 + 8;
    } while (1 < lVar5);
    psVar4 = (storage_type_conflict *)(ulong)((uint)str.m_data & 3);
  }
  if (psVar4 != (storage_type_conflict *)0x1) {
    if (psVar4 != (storage_type_conflict *)0x2) {
      if (psVar4 != (storage_type_conflict *)0x3) {
        return (char16_t *)(this + (long)psVar6 * 2);
      }
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)
                         (ulong)uVar3,(QChar *)(ulong)(ushort)*(char16_t *)pQVar8);
      if (bVar1) {
        return (char16_t *)pQVar8;
      }
      pQVar8 = pQVar8 + 2;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)
                       (ulong)uVar3,(QChar *)(ulong)(ushort)*(char16_t *)pQVar8);
    if (bVar1) {
      return (char16_t *)pQVar8;
    }
    pQVar8 = pQVar8 + 2;
  }
  bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
          operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)(ulong)uVar3,
                     (QChar *)(ulong)(ushort)*(char16_t *)pQVar8);
  if (!bVar1) {
    return (char16_t *)(this + (long)psVar6 * 2);
  }
  return (char16_t *)pQVar8;
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrcasechr(QStringView str, char16_t c) noexcept
{
    const QChar *n = str.begin();
    const QChar *e = str.end();
    c = foldCase(c);
    auto it = std::find_if(n, e, [c](auto ch) { return foldAndCompare(ch, QChar(c)); });
    return reinterpret_cast<const char16_t *>(it);
}